

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# DisjunctiveIntervalMap.h
# Opt level: O3

bool __thiscall
dg::ADT::DisjunctiveIntervalMap<dg::dda::RWNode*,dg::Offset>::
_addValue<std::_Rb_tree_iterator<std::pair<dg::ADT::DiscreteInterval<dg::Offset>const,std::set<dg::dda::RWNode*,std::less<dg::dda::RWNode*>,std::allocator<dg::dda::RWNode*>>>>>
          (DisjunctiveIntervalMap<dg::dda::RWNode*,dg::Offset> *this,
          _Rb_tree_iterator<std::pair<const_dg::ADT::DiscreteInterval<dg::Offset>,_std::set<dg::dda::RWNode_*,_std::less<dg::dda::RWNode_*>,_std::allocator<dg::dda::RWNode_*>_>_>_>
          I,RWNode *val,bool update)

{
  _Base_ptr *this_00;
  byte bVar1;
  _Link_type p_Var2;
  undefined7 in_register_00000009;
  _Link_type __x;
  _Link_type p_Var3;
  bool bVar4;
  pair<std::_Rb_tree_iterator<dg::dda::RWNode_*>,_bool> pVar5;
  RWNode *local_18;
  
  this_00 = &I._M_node[1]._M_left;
  local_18 = val;
  if ((int)CONCAT71(in_register_00000009,update) == 0) {
    pVar5 = std::
            _Rb_tree<dg::dda::RWNode*,dg::dda::RWNode*,std::_Identity<dg::dda::RWNode*>,std::less<dg::dda::RWNode*>,std::allocator<dg::dda::RWNode*>>
            ::_M_insert_unique<dg::dda::RWNode*const&>
                      ((_Rb_tree<dg::dda::RWNode*,dg::dda::RWNode*,std::_Identity<dg::dda::RWNode*>,std::less<dg::dda::RWNode*>,std::allocator<dg::dda::RWNode*>>
                        *)this_00,&local_18);
    bVar1 = pVar5.second;
  }
  else {
    __x = *(_Link_type *)(I._M_node + 2);
    if (I._M_node[2]._M_right == (_Base_ptr)0x1) {
      if (__x == (_Link_type)0x0) {
        __x = (_Link_type)0x0;
      }
      else {
        p_Var2 = (_Link_type)&I._M_node[1]._M_right;
        p_Var3 = __x;
        do {
          bVar4 = *(RWNode **)(p_Var3->_M_storage)._M_storage < val;
          if (!bVar4) {
            p_Var2 = p_Var3;
          }
          p_Var3 = *(_Link_type *)(&p_Var3->_M_storage)[(ulong)bVar4 - 2]._M_storage;
        } while (p_Var3 != (_Link_type)0x0);
        if ((p_Var2 != (_Link_type)&I._M_node[1]._M_right) &&
           (*(RWNode **)(p_Var2->_M_storage)._M_storage <= val)) {
          bVar1 = 0;
          goto LAB_001153b3;
        }
      }
    }
    std::
    _Rb_tree<dg::dda::RWNode_*,_dg::dda::RWNode_*,_std::_Identity<dg::dda::RWNode_*>,_std::less<dg::dda::RWNode_*>,_std::allocator<dg::dda::RWNode_*>_>
    ::_M_erase((_Rb_tree<dg::dda::RWNode_*,_dg::dda::RWNode_*,_std::_Identity<dg::dda::RWNode_*>,_std::less<dg::dda::RWNode_*>,_std::allocator<dg::dda::RWNode_*>_>
                *)this_00,__x);
    *(undefined8 *)(I._M_node + 2) = 0;
    I._M_node[2]._M_parent = (_Base_ptr)&I._M_node[1]._M_right;
    I._M_node[2]._M_left = (_Base_ptr)&I._M_node[1]._M_right;
    I._M_node[2]._M_right = (_Base_ptr)0x0;
    std::
    _Rb_tree<dg::dda::RWNode*,dg::dda::RWNode*,std::_Identity<dg::dda::RWNode*>,std::less<dg::dda::RWNode*>,std::allocator<dg::dda::RWNode*>>
    ::_M_insert_unique<dg::dda::RWNode*const&>
              ((_Rb_tree<dg::dda::RWNode*,dg::dda::RWNode*,std::_Identity<dg::dda::RWNode*>,std::less<dg::dda::RWNode*>,std::allocator<dg::dda::RWNode*>>
                *)this_00,&local_18);
    bVar1 = 1;
  }
LAB_001153b3:
  return (bool)(bVar1 & 1);
}

Assistant:

bool _addValue(IteratorT I, ValueT val, bool update) {
        if (update) {
            if (I->second.size() == 1 && I->second.count(val) > 0)
                return false;

            I->second.clear();
            I->second.insert(val);
            return true;
        }

        return I->second.insert(val).second;
    }